

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_builder.cc
# Opt level: O0

bool __thiscall
bssl::CertPathIter::GetNextPath
          (CertPathIter *this,ParsedCertificateList *out_certs,CertificateTrust *out_last_cert_trust
          ,CertPathErrors *out_errors,CertPathBuilderDelegate *delegate,uint32_t *iteration_count,
          uint32_t max_iteration_count,uint32_t max_path_building_depth)

{
  CertificateTrustType CVar1;
  uint32_t *puVar2;
  CertPathBuilderDelegate *this_00;
  bool bVar3;
  ulong uVar4;
  size_t sVar5;
  CertErrors *pCVar6;
  CertIssuersIter *pCVar7;
  size_type sVar8;
  element_type *cert;
  SignatureVerifyCache *cache;
  element_type *peVar9;
  ParsedCertificate *cert_00;
  undefined1 auVar10 [16];
  string local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  undefined1 local_280 [16];
  IssuerEntry local_270;
  CertIssuerSources *local_250;
  undefined1 local_248 [40];
  string local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  undefined1 local_1e0 [16];
  IssuerEntry local_1d0;
  string local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  undefined1 local_170 [16];
  CertificateTrust local_160;
  basic_string_view<char,_std::char_traits<char>_> local_158;
  CertificateTrust local_148;
  basic_string_view<char,_std::char_traits<char>_> local_140;
  CertificateTrust local_130;
  basic_string_view<char,_std::char_traits<char>_> local_128;
  basic_string_view<char,_std::char_traits<char>_> local_118;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  undefined1 local_c8 [16];
  basic_string_view<char,_std::char_traits<char>_> local_b8 [2];
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 local_58 [16];
  CertificateTrust local_48;
  uint *local_40;
  uint32_t *iteration_count_local;
  CertPathBuilderDelegate *delegate_local;
  CertPathErrors *out_errors_local;
  CertificateTrust *out_last_cert_trust_local;
  ParsedCertificateList *out_certs_local;
  CertPathIter *this_local;
  
  local_40 = iteration_count;
  iteration_count_local = (uint32_t *)delegate;
  delegate_local = (CertPathBuilderDelegate *)out_errors;
  out_errors_local = (CertPathErrors *)out_last_cert_trust;
  out_last_cert_trust_local = (CertificateTrust *)out_certs;
  out_certs_local = (ParsedCertificateList *)this;
  ::std::
  vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
  ::clear(out_certs);
  local_48 = CertificateTrust::ForUnspecified();
  (out_errors_local->cert_errors_).
  super__Vector_base<bssl::CertErrors,_std::allocator<bssl::CertErrors>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_48;
LAB_005f6901:
  do {
    uVar4 = (**(code **)(*(long *)iteration_count_local + 0x38))();
    if ((uVar4 & 1) != 0) {
      bVar3 = anon_unknown_6::CertIssuerIterPath::Empty(&this->cur_path_);
      if (bVar3) {
        bVar3 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this);
        if (bVar3) {
          ::std::
          vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
          ::push_back((vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                       *)out_last_cert_trust_local,(value_type *)this);
        }
      }
      else {
        anon_unknown_6::CertIssuerIterPath::CopyPath
                  (&this->cur_path_,(ParsedCertificateList *)out_last_cert_trust_local);
      }
      pCVar6 = CertPathErrors::GetOtherErrors((CertPathErrors *)delegate_local);
      CertErrors::AddError(pCVar6,"Deadline exceeded");
      return false;
    }
    if (max_path_building_depth != 0) {
      sVar5 = anon_unknown_6::CertIssuerIterPath::Length(&this->cur_path_);
      if (max_path_building_depth <= sVar5) {
        anon_unknown_6::CertIssuerIterPath::CopyPath
                  (&this->cur_path_,(ParsedCertificateList *)out_last_cert_trust_local);
        pCVar6 = CertPathErrors::GetOtherErrors((CertPathErrors *)delegate_local);
        CertErrors::AddError(pCVar6,"Depth limit exceeded");
        auVar10 = (**(code **)(*(long *)iteration_count_local + 0x40))();
        puVar2 = iteration_count_local;
        if ((auVar10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          (anonymous_namespace)::PathDebugString_abi_cxx11_
                    (&local_98,(_anonymous_namespace_ *)out_last_cert_trust_local,auVar10._8_8_);
          ::std::operator+(&local_78,
                           "CertPathIter reached depth limit. Returning partial path and backtracking:\n"
                           ,&local_98);
          local_58 = ::std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_78)
          ;
          (**(code **)(*(long *)puVar2 + 0x48))(puVar2,local_58._0_8_,local_58._8_8_);
          ::std::__cxx11::string::~string((string *)&local_78);
          ::std::__cxx11::string::~string((string *)&local_98);
        }
        anon_unknown_6::CertIssuerIterPath::Pop(&this->cur_path_);
        return true;
      }
    }
    bVar3 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this);
    if (!bVar3) {
      bVar3 = anon_unknown_6::CertIssuerIterPath::Empty(&this->cur_path_);
      if (bVar3) {
        uVar4 = (**(code **)(*(long *)iteration_count_local + 0x40))();
        puVar2 = iteration_count_local;
        if ((uVar4 & 1) != 0) {
          ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (local_b8,"CertPathIter exhausted all paths...");
          (**(code **)(*(long *)puVar2 + 0x48))(puVar2,local_b8[0]._M_len,local_b8[0]._M_str);
        }
        return false;
      }
      *local_40 = *local_40 + 1;
      if ((max_iteration_count != 0) && (max_iteration_count < *local_40)) {
        anon_unknown_6::CertIssuerIterPath::CopyPath
                  (&this->cur_path_,(ParsedCertificateList *)out_last_cert_trust_local);
        pCVar6 = CertPathErrors::GetOtherErrors((CertPathErrors *)delegate_local);
        CertErrors::AddError(pCVar6,"Iteration limit exceeded");
        return false;
      }
      pCVar7 = anon_unknown_6::CertIssuerIterPath::back(&this->cur_path_);
      anon_unknown_6::CertIssuersIter::GetNextIssuer(pCVar7,&this->next_issuer_);
      bVar3 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this);
      if (!bVar3) {
        pCVar7 = anon_unknown_6::CertIssuerIterPath::back(&this->cur_path_);
        bVar3 = anon_unknown_6::CertIssuersIter::had_non_skipped_issuers(pCVar7);
        if (!bVar3) {
          anon_unknown_6::CertIssuerIterPath::CopyPath
                    (&this->cur_path_,(ParsedCertificateList *)out_last_cert_trust_local);
          this_00 = delegate_local;
          sVar8 = ::std::
                  vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                  ::size((vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                          *)out_last_cert_trust_local);
          pCVar6 = CertPathErrors::GetErrorsForCert((CertPathErrors *)this_00,sVar8 - 1);
          CertErrors::AddError(pCVar6,"No matching issuer found");
          auVar10 = (**(code **)(*(long *)iteration_count_local + 0x40))();
          puVar2 = iteration_count_local;
          if ((auVar10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            (anonymous_namespace)::PathDebugString_abi_cxx11_
                      (&local_108,(_anonymous_namespace_ *)out_last_cert_trust_local,auVar10._8_8_);
            ::std::operator+(&local_e8,"CertPathIter returning partial path and backtracking:\n",
                             &local_108);
            local_c8 = ::std::__cxx11::string::operator_cast_to_basic_string_view
                                 ((string *)&local_e8);
            (**(code **)(*(long *)puVar2 + 0x48))(puVar2,local_c8._0_8_,local_c8._8_8_);
            ::std::__cxx11::string::~string((string *)&local_e8);
            ::std::__cxx11::string::~string((string *)&local_108);
          }
          anon_unknown_6::CertIssuerIterPath::Pop(&this->cur_path_);
          return true;
        }
        uVar4 = (**(code **)(*(long *)iteration_count_local + 0x40))();
        puVar2 = iteration_count_local;
        if ((uVar4 & 1) != 0) {
          ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_118,"CertPathIter backtracking...");
          (**(code **)(*(long *)puVar2 + 0x48))(puVar2,local_118._M_len,local_118._M_str);
        }
        anon_unknown_6::CertIssuerIterPath::Pop(&this->cur_path_);
        goto LAB_005f6901;
      }
    }
    switch((this->next_issuer_).trust.type) {
    case DISTRUSTED:
    case UNSPECIFIED:
    case TRUSTED_ANCHOR_OR_LEAF:
      break;
    case LAST:
      bVar3 = anon_unknown_6::CertIssuerIterPath::Empty(&this->cur_path_);
      if (bVar3) {
        uVar4 = (**(code **)(*(long *)iteration_count_local + 0x40))();
        puVar2 = iteration_count_local;
        if ((uVar4 & 1) != 0) {
          ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_128,"Leaf is a trust anchor, considering as UNSPECIFIED");
          (**(code **)(*(long *)puVar2 + 0x48))(puVar2,local_128._M_len,local_128._M_str);
        }
        local_130 = CertificateTrust::ForUnspecified();
        (this->next_issuer_).trust = local_130;
      }
      break;
    case TRUSTED_LEAF:
      bVar3 = anon_unknown_6::CertIssuerIterPath::Empty(&this->cur_path_);
      if (!bVar3) {
        uVar4 = (**(code **)(*(long *)iteration_count_local + 0x40))();
        puVar2 = iteration_count_local;
        if ((uVar4 & 1) != 0) {
          ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_140,"Issuer is a trust leaf, considering as UNSPECIFIED");
          (**(code **)(*(long *)puVar2 + 0x48))(puVar2,local_140._M_len,local_140._M_str);
        }
        local_148 = CertificateTrust::ForUnspecified();
        (this->next_issuer_).trust = local_148;
      }
    }
    CVar1 = (this->next_issuer_).trust.type;
    if ((LAST < CVar1) && (CVar1 == TRUSTED_ANCHOR_OR_LEAF || CVar1 == TRUSTED_LEAF)) {
      bVar3 = anon_unknown_6::CertIssuerIterPath::Empty(&this->cur_path_);
      if ((bVar3) && (((this->next_issuer_).trust.require_leaf_selfsigned & 1U) != 0)) {
        cert = ::std::
               __shared_ptr_access<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)this);
        cache = (SignatureVerifyCache *)(**(code **)(*(long *)iteration_count_local + 0x10))();
        bVar3 = VerifyCertificateIsSelfSigned(cert,cache,(CertErrors *)0x0);
        if (!bVar3) {
          uVar4 = (**(code **)(*(long *)iteration_count_local + 0x40))();
          puVar2 = iteration_count_local;
          if ((uVar4 & 1) != 0) {
            ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_158,
                       "Leaf is trusted with require_leaf_selfsigned but is not self-signed, considering as UNSPECIFIED"
                      );
            (**(code **)(*(long *)puVar2 + 0x48))(puVar2,local_158._M_len,local_158._M_str);
          }
          local_160 = CertificateTrust::ForUnspecified();
          (this->next_issuer_).trust = local_160;
        }
      }
    }
    CVar1 = (this->next_issuer_).trust.type;
    if (CVar1 == DISTRUSTED) goto LAB_005f7001;
    if (CVar1 == UNSPECIFIED) {
      peVar9 = ::std::__shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>::get
                         ((__shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2> *
                          )this);
      bVar3 = anon_unknown_6::CertIssuerIterPath::IsPresent(&this->cur_path_,peVar9);
      if (bVar3) {
        pCVar7 = anon_unknown_6::CertIssuerIterPath::back(&this->cur_path_);
        anon_unknown_6::CertIssuersIter::increment_skipped_issuer_count(pCVar7);
        uVar4 = (**(code **)(*(long *)iteration_count_local + 0x40))();
        puVar2 = iteration_count_local;
        if ((uVar4 & 1) != 0) {
          peVar9 = ::std::__shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>::
                   get((__shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2> *)
                       this);
          (anonymous_namespace)::CertDebugString_abi_cxx11_
                    (&local_220,(_anonymous_namespace_ *)peVar9,cert_00);
          ::std::operator+(&local_200,"CertPathIter skipping dupe cert: ",&local_220);
          auVar10 = ::std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_200)
          ;
          local_1e0 = auVar10;
          (**(code **)(*(long *)puVar2 + 0x48))(puVar2,auVar10._0_8_,auVar10._8_8_);
          ::std::__cxx11::string::~string((string *)&local_200);
          ::std::__cxx11::string::~string((string *)&local_220);
        }
        memset(local_248 + 8,0,0x20);
        anon_unknown_6::IssuerEntry::IssuerEntry((IssuerEntry *)(local_248 + 8));
        anon_unknown_6::IssuerEntry::operator=(&this->next_issuer_,(IssuerEntry *)(local_248 + 8));
        anon_unknown_6::IssuerEntry::~IssuerEntry((IssuerEntry *)(local_248 + 8));
      }
      else {
        local_250 = &this->cert_issuer_sources_;
        ::std::
        make_unique<bssl::(anonymous_namespace)::CertIssuersIter,std::shared_ptr<bssl::ParsedCertificate_const>,std::vector<bssl::CertIssuerSource*,std::allocator<bssl::CertIssuerSource*>>*,bssl::TrustStore*&>
                  ((shared_ptr<const_bssl::ParsedCertificate> *)local_248,
                   (vector<bssl::CertIssuerSource_*,_std::allocator<bssl::CertIssuerSource_*>_> **)
                   this,(TrustStore **)&local_250);
        anon_unknown_6::CertIssuerIterPath::Append
                  (&this->cur_path_,
                   (unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
                    *)local_248);
        ::std::
        unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
        ::~unique_ptr((unique_ptr<bssl::(anonymous_namespace)::CertIssuersIter,_std::default_delete<bssl::(anonymous_namespace)::CertIssuersIter>_>
                       *)local_248);
        memset(&local_270,0,0x20);
        anon_unknown_6::IssuerEntry::IssuerEntry(&local_270);
        anon_unknown_6::IssuerEntry::operator=(&this->next_issuer_,&local_270);
        anon_unknown_6::IssuerEntry::~IssuerEntry(&local_270);
        uVar4 = (**(code **)(*(long *)iteration_count_local + 0x40))();
        puVar2 = iteration_count_local;
        if ((uVar4 & 1) != 0) {
          (anonymous_namespace)::CertIssuerIterPath::PathDebugString_abi_cxx11_
                    (&local_2c0,&this->cur_path_);
          ::std::operator+(&local_2a0,"CertPathIter cur_path_ =\n",&local_2c0);
          auVar10 = ::std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_2a0)
          ;
          local_280 = auVar10;
          (**(code **)(*(long *)puVar2 + 0x48))(puVar2,auVar10._0_8_,auVar10._8_8_);
          ::std::__cxx11::string::~string((string *)&local_2a0);
          ::std::__cxx11::string::~string((string *)&local_2c0);
        }
      }
    }
    else if (CVar1 - LAST < 3) {
LAB_005f7001:
      anon_unknown_6::CertIssuerIterPath::CopyPath
                (&this->cur_path_,(ParsedCertificateList *)out_last_cert_trust_local);
      ::std::
      vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
      ::push_back((vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                   *)out_last_cert_trust_local,(value_type *)this);
      auVar10 = (**(code **)(*(long *)iteration_count_local + 0x40))();
      puVar2 = iteration_count_local;
      if ((auVar10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        (anonymous_namespace)::PathDebugString_abi_cxx11_
                  (&local_1b0,(_anonymous_namespace_ *)out_last_cert_trust_local,auVar10._8_8_);
        ::std::operator+(&local_190,"CertPathIter returning path:\n",&local_1b0);
        local_170 = ::std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_190)
        ;
        (**(code **)(*(long *)puVar2 + 0x48))(puVar2,local_170._0_8_,local_170._8_8_);
        ::std::__cxx11::string::~string((string *)&local_190);
        ::std::__cxx11::string::~string((string *)&local_1b0);
      }
      (out_errors_local->cert_errors_).
      super__Vector_base<bssl::CertErrors,_std::allocator<bssl::CertErrors>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)(this->next_issuer_).trust;
      memset(&local_1d0,0,0x20);
      anon_unknown_6::IssuerEntry::IssuerEntry(&local_1d0);
      anon_unknown_6::IssuerEntry::operator=(&this->next_issuer_,&local_1d0);
      anon_unknown_6::IssuerEntry::~IssuerEntry(&local_1d0);
      return true;
    }
  } while( true );
}

Assistant:

bool CertPathIter::GetNextPath(ParsedCertificateList *out_certs,
                               CertificateTrust *out_last_cert_trust,
                               CertPathErrors *out_errors,
                               CertPathBuilderDelegate *delegate,
                               uint32_t *iteration_count,
                               const uint32_t max_iteration_count,
                               const uint32_t max_path_building_depth) {
  out_certs->clear();
  *out_last_cert_trust = CertificateTrust::ForUnspecified();

  while (true) {
    if (delegate->IsDeadlineExpired()) {
      if (cur_path_.Empty()) {
        // If the deadline is already expired before the first call to
        // GetNextPath, cur_path_ will be empty. Return the leaf cert in that
        // case.
        if (next_issuer_.cert) {
          out_certs->push_back(next_issuer_.cert);
        }
      } else {
        cur_path_.CopyPath(out_certs);
      }
      out_errors->GetOtherErrors()->AddError(cert_errors::kDeadlineExceeded);
      return false;
    }

    // We are not done yet, so if the current path is at the depth limit then
    // we must backtrack to find an acceptable solution.
    if (max_path_building_depth > 0 &&
        cur_path_.Length() >= max_path_building_depth) {
      cur_path_.CopyPath(out_certs);
      out_errors->GetOtherErrors()->AddError(cert_errors::kDepthLimitExceeded);
      if (delegate->IsDebugLogEnabled()) {
        delegate->DebugLog(
            "CertPathIter reached depth limit. Returning "
            "partial path and backtracking:\n" +
            PathDebugString(*out_certs));
      }
      cur_path_.Pop();
      return true;
    }

    if (!next_issuer_.cert) {
      if (cur_path_.Empty()) {
        if (delegate->IsDebugLogEnabled()) {
          delegate->DebugLog("CertPathIter exhausted all paths...");
        }
        return false;
      }

      (*iteration_count)++;
      if (max_iteration_count > 0 && *iteration_count > max_iteration_count) {
        cur_path_.CopyPath(out_certs);
        out_errors->GetOtherErrors()->AddError(
            cert_errors::kIterationLimitExceeded);
        return false;
      }

      cur_path_.back()->GetNextIssuer(&next_issuer_);
      if (!next_issuer_.cert) {
        if (!cur_path_.back()->had_non_skipped_issuers()) {
          // If the end of a path was reached without finding an anchor, return
          // the partial path before backtracking.
          cur_path_.CopyPath(out_certs);
          out_errors->GetErrorsForCert(out_certs->size() - 1)
              ->AddError(cert_errors::kNoIssuersFound);
          if (delegate->IsDebugLogEnabled()) {
            delegate->DebugLog(
                "CertPathIter returning partial path and backtracking:\n" +
                PathDebugString(*out_certs));
          }
          cur_path_.Pop();
          return true;
        } else {
          // No more issuers for current chain, go back up and see if there are
          // any more for the previous cert.
          if (delegate->IsDebugLogEnabled()) {
            delegate->DebugLog("CertPathIter backtracking...");
          }
          cur_path_.Pop();
          continue;
        }
      }
    }

    // Overrides for cert with trust appearing in the wrong place for the type
    // of trust (trusted leaf in non-leaf position, or trust anchor in leaf
    // position.)
    switch (next_issuer_.trust.type) {
      case CertificateTrustType::TRUSTED_ANCHOR:
        // If the leaf cert is trusted only as an anchor, treat it as having
        // unspecified trust. This may allow a successful path to be built to a
        // different root (or to the same cert if it's self-signed).
        if (cur_path_.Empty()) {
          if (delegate->IsDebugLogEnabled()) {
            delegate->DebugLog(
                "Leaf is a trust anchor, considering as UNSPECIFIED");
          }
          next_issuer_.trust = CertificateTrust::ForUnspecified();
        }
        break;
      case CertificateTrustType::TRUSTED_LEAF:
        // If a non-leaf cert is trusted only as a leaf, treat it as having
        // unspecified trust. This may allow a successful path to be built to a
        // trusted root.
        if (!cur_path_.Empty()) {
          if (delegate->IsDebugLogEnabled()) {
            delegate->DebugLog(
                "Issuer is a trust leaf, considering as UNSPECIFIED");
          }
          next_issuer_.trust = CertificateTrust::ForUnspecified();
        }
        break;
      case CertificateTrustType::DISTRUSTED:
      case CertificateTrustType::UNSPECIFIED:
      case CertificateTrustType::TRUSTED_ANCHOR_OR_LEAF:
        // No override necessary.
        break;
    }

    // Overrides for trusted leaf cert with require_leaf_selfsigned. If the leaf
    // isn't actually self-signed, treat it as unspecified.
    switch (next_issuer_.trust.type) {
      case CertificateTrustType::TRUSTED_LEAF:
      case CertificateTrustType::TRUSTED_ANCHOR_OR_LEAF:
        if (cur_path_.Empty() && next_issuer_.trust.require_leaf_selfsigned &&
            !VerifyCertificateIsSelfSigned(*next_issuer_.cert,
                                           delegate->GetVerifyCache(),
                                           /*errors=*/nullptr)) {
          if (delegate->IsDebugLogEnabled()) {
            delegate->DebugLog(
                "Leaf is trusted with require_leaf_selfsigned but is "
                "not self-signed, considering as UNSPECIFIED");
          }
          next_issuer_.trust = CertificateTrust::ForUnspecified();
        }
        break;
      case CertificateTrustType::TRUSTED_ANCHOR:
      case CertificateTrustType::DISTRUSTED:
      case CertificateTrustType::UNSPECIFIED:
        // No override necessary.
        break;
    }

    switch (next_issuer_.trust.type) {
      // If the trust for this issuer is "known" (either because it is
      // distrusted, or because it is trusted) then stop building and return the
      // path.
      case CertificateTrustType::DISTRUSTED:
      case CertificateTrustType::TRUSTED_ANCHOR:
      case CertificateTrustType::TRUSTED_ANCHOR_OR_LEAF:
      case CertificateTrustType::TRUSTED_LEAF: {
        // If the issuer has a known trust level, can stop building the path.
        cur_path_.CopyPath(out_certs);
        out_certs->push_back(std::move(next_issuer_.cert));
        if (delegate->IsDebugLogEnabled()) {
          delegate->DebugLog("CertPathIter returning path:\n" +
                             PathDebugString(*out_certs));
        }
        *out_last_cert_trust = next_issuer_.trust;
        next_issuer_ = IssuerEntry();
        return true;
      }
      case CertificateTrustType::UNSPECIFIED: {
        // Skip this cert if it is already in the chain.
        if (cur_path_.IsPresent(next_issuer_.cert.get())) {
          cur_path_.back()->increment_skipped_issuer_count();
          if (delegate->IsDebugLogEnabled()) {
            delegate->DebugLog("CertPathIter skipping dupe cert: " +
                               CertDebugString(next_issuer_.cert.get()));
          }
          next_issuer_ = IssuerEntry();
          continue;
        }

        cur_path_.Append(std::make_unique<CertIssuersIter>(
            std::move(next_issuer_.cert), &cert_issuer_sources_, trust_store_));
        next_issuer_ = IssuerEntry();
        if (delegate->IsDebugLogEnabled()) {
          delegate->DebugLog("CertPathIter cur_path_ =\n" +
                             cur_path_.PathDebugString());
        }
        // Continue descending the tree.
        continue;
      }
    }
  }
}